

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_comparison_unit.c
# Opt level: O0

container_t * container_create(uint8_t typecode)

{
  uint line;
  array_container_t *file;
  byte in_DIL;
  unsigned_long unaff_retaddr;
  container_t *result;
  undefined7 in_stack_fffffffffffffff8;
  
  line = (uint)in_DIL;
  if (line == 1) {
    file = (array_container_t *)bitset_container_create();
  }
  else if (line == 2) {
    file = array_container_create();
  }
  else {
    file = (array_container_t *)run_container_create();
  }
  _assert_true(unaff_retaddr,(char *)CONCAT17(in_DIL,in_stack_fffffffffffffff8),(char *)file,line);
  return file;
}

Assistant:

static inline container_t *container_create(uint8_t typecode) {
    container_t *result = NULL;
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            result = bitset_container_create();
            break;
        case ARRAY_CONTAINER_TYPE:
            result = array_container_create();
            break;
        case RUN_CONTAINER_TYPE:
            result = run_container_create();
            break;
        default:
            assert(false);
            roaring_unreachable;
    }
    assert_non_null(result);
    return result;
}